

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cc
# Opt level: O0

void lrit::to_json(json *j,NOAALRITHeader *h)

{
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> agencySignature;
  string raw;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb40;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffb48;
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *in_stack_fffffffffffffb50;
  initializer_list<nlohmann::detail::json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  in_stack_fffffffffffffb58;
  value_t in_stack_fffffffffffffbce;
  undefined1 in_stack_fffffffffffffbcf;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_fffffffffffffbd0;
  initializer_list_t in_stack_fffffffffffffbd8;
  undefined1 **local_3c8;
  undefined1 **local_3b0;
  undefined1 **local_398;
  undefined1 **local_380;
  undefined1 **local_368;
  undefined1 **local_350;
  undefined1 *local_2f8 [8];
  undefined8 *local_2b8;
  undefined8 local_2b0;
  uint local_2a4;
  undefined8 *local_2a0;
  undefined1 *local_298 [4];
  undefined1 local_278 [32];
  undefined8 *local_258;
  undefined8 local_250;
  uint local_244;
  undefined8 *local_240;
  undefined1 *local_238 [4];
  undefined1 local_218 [32];
  undefined8 *local_1f8;
  undefined8 local_1f0;
  uint local_1e4;
  undefined8 *local_1e0;
  undefined1 *local_1d8 [4];
  undefined1 local_1b8 [32];
  undefined8 *local_198;
  undefined8 local_190;
  undefined8 *local_188;
  undefined1 *local_180 [4];
  undefined1 local_160 [32];
  undefined8 *local_140;
  undefined8 local_138;
  undefined8 *local_130;
  undefined1 *local_128 [4];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined8 *local_88;
  undefined8 local_80;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,(char *)(in_RSI + 4),4,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::find((char)local_30,0);
  std::__cxx11::string::substr((ulong)local_68,(ulong)local_30);
  local_130 = local_128;
  local_188 = local_180;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[16]>(in_stack_fffffffffffffb40,(char (*) [16])in_stack_fffffffffffffb38);
  local_188 = (undefined8 *)local_160;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<std::__cxx11::string_const&>(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  local_140 = local_180;
  local_138 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_130 = (undefined8 *)local_108;
  local_1e0 = local_1d8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[10]>(in_stack_fffffffffffffb40,(char (*) [10])in_stack_fffffffffffffb38);
  local_1e0 = (undefined8 *)local_1b8;
  local_1e4 = (uint)*(ushort *)(local_10 + 8);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_198 = local_1d8;
  local_190 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_130 = (undefined8 *)local_e8;
  local_240 = local_238;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[13]>(in_stack_fffffffffffffb40,(char (*) [13])in_stack_fffffffffffffb38);
  local_240 = (undefined8 *)local_218;
  local_244 = (uint)*(ushort *)(local_10 + 10);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_1f8 = local_238;
  local_1f0 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_130 = (undefined8 *)local_c8;
  local_2a0 = local_298;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[10]>(in_stack_fffffffffffffb40,(char (*) [10])in_stack_fffffffffffffb38);
  local_2a0 = (undefined8 *)local_278;
  local_2a4 = (uint)*(ushort *)(local_10 + 0xc);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_258 = local_298;
  local_250 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_130 = (undefined8 *)local_a8;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
  ::json_ref<char_const(&)[24]>(in_stack_fffffffffffffb40,(char (*) [24])in_stack_fffffffffffffb38);
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref<int>(in_stack_fffffffffffffb40,(int *)in_stack_fffffffffffffb38);
  local_2b8 = local_2f8;
  local_2b0 = 2;
  nlohmann::detail::
  json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::json_ref(in_stack_fffffffffffffb50,in_stack_fffffffffffffb58);
  local_88 = local_128;
  local_80 = 5;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8,(bool)in_stack_fffffffffffffbcf,
               in_stack_fffffffffffffbce);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=(&in_stack_fffffffffffffb50->owned_value,in_stack_fffffffffffffb48);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&in_stack_fffffffffffffb40->owned_value);
  local_350 = (undefined1 **)&local_88;
  do {
    local_350 = local_350 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7a37);
  } while (local_350 != local_128);
  local_368 = (undefined1 **)&local_2b8;
  do {
    local_368 = local_368 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7a89);
  } while (local_368 != local_2f8);
  local_380 = (undefined1 **)&local_258;
  do {
    local_380 = local_380 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7adb);
  } while (local_380 != local_298);
  local_398 = (undefined1 **)&local_1f8;
  do {
    local_398 = local_398 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7b2d);
  } while (local_398 != local_238);
  local_3b0 = (undefined1 **)&local_198;
  do {
    local_3b0 = local_3b0 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7b7f);
  } while (local_3b0 != local_1d8);
  local_3c8 = (undefined1 **)&local_140;
  do {
    local_3c8 = local_3c8 + -4;
    nlohmann::detail::
    json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
    ::~json_ref((json_ref<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 *)0x2c7bd1);
  } while (local_3c8 != local_180);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void to_json(json& j, const NOAALRITHeader& h) {
  // Signature field has 4 bytes, but the string may be shorter.
  // Trim to substring excluding first NUL, if applicable.
  const auto raw = std::string(h.agencySignature, sizeof(h.agencySignature));
  const auto agencySignature = raw.substr(0, raw.find('\0'));
  j = {
      {"AgencySignature", agencySignature},
      {"ProductID", int(h.productID)},
      {"ProductSubID", int(h.productSubID)},
      {"Parameter", int(h.parameter)},
      {"NOAASpecificCompression", int(h.noaaSpecificCompression)},
  };
}